

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitStringSliceWTF
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,StringSliceWTF *curr)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  Literal *x;
  Literal local_190;
  ulong local_178;
  size_t i;
  Literals contents;
  unsigned_long local_130;
  uint64_t endVal;
  uint64_t startVal;
  Literals *refValues;
  shared_ptr<wasm::GCData> refData;
  Flow end;
  Flow start;
  undefined1 local_68 [8];
  Flow ref;
  StringSliceWTF *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,*(Expression **)(curr + 0x10));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    visit((Flow *)&end.breakTo.super_IString.str._M_str,this,
          *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
    bVar2 = Flow::breaking((Flow *)&end.breakTo.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&end.breakTo.super_IString.str._M_str);
    }
    else {
      visit((Flow *)&refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,this,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20))
      ;
      bVar2 = Flow::breaking((Flow *)&refData.
                                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
      if (bVar2) {
        Flow::Flow(__return_storage_ptr__,
                   (Flow *)&refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      }
      else {
        Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::getGCData();
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&refValues);
        if (!bVar2) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&refValues);
        startVal = (uint64_t)&peVar3->values;
        Flow::getSingleValue((Flow *)&end.breakTo.super_IString.str._M_str);
        endVal = ::wasm::Literal::getUnsigned();
        Flow::getSingleValue
                  ((Flow *)&refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        local_130 = ::wasm::Literal::getUnsigned();
        contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)SmallVector<wasm::Literal,_1UL>::size
                                ((SmallVector<wasm::Literal,_1UL> *)startVal);
        puVar4 = std::min<unsigned_long>
                           (&local_130,
                            (unsigned_long *)
                            &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_130 = *puVar4;
        Literals::Literals((Literals *)&i);
        if (endVal < local_130) {
          SmallVector<wasm::Literal,_1UL>::reserve
                    ((SmallVector<wasm::Literal,_1UL> *)&i,local_130 - endVal);
          for (local_178 = endVal; uVar1 = local_178, local_178 < local_130;
              local_178 = local_178 + 1) {
            sVar5 = SmallVector<wasm::Literal,_1UL>::size
                              ((SmallVector<wasm::Literal,_1UL> *)startVal);
            if (uVar1 < sVar5) {
              x = SmallVector<wasm::Literal,_1UL>::operator[]
                            ((SmallVector<wasm::Literal,_1UL> *)startVal,local_178);
              SmallVector<wasm::Literal,_1UL>::push_back((SmallVector<wasm::Literal,_1UL> *)&i,x);
            }
          }
        }
        makeGCData(&local_190,this,(Literals *)&i,
                   (Type)*(uintptr_t *)(ref.breakTo.super_IString.str._M_str + 8));
        Flow::Flow(__return_storage_ptr__,&local_190);
        ::wasm::Literal::~Literal(&local_190);
        Literals::~Literals((Literals *)&i);
        std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&refValues);
      }
      Flow::~Flow((Flow *)&refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    Flow::~Flow((Flow *)&end.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringSliceWTF(StringSliceWTF* curr) {
    Flow ref = visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow start = visit(curr->start);
    if (start.breaking()) {
      return start;
    }
    Flow end = visit(curr->end);
    if (end.breaking()) {
      return end;
    }

    auto refData = ref.getSingleValue().getGCData();
    if (!refData) {
      trap("null ref");
    }
    auto& refValues = refData->values;
    auto startVal = start.getSingleValue().getUnsigned();
    auto endVal = end.getSingleValue().getUnsigned();
    endVal = std::min<size_t>(endVal, refValues.size());

    Literals contents;
    if (endVal > startVal) {
      contents.reserve(endVal - startVal);
      for (size_t i = startVal; i < endVal; i++) {
        if (i < refValues.size()) {
          contents.push_back(refValues[i]);
        }
      }
    }
    return makeGCData(std::move(contents), curr->type);
  }